

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_241840::CpuZeropageTest_rra_zero_sets_n_and_v_Test::
~CpuZeropageTest_rra_zero_sets_n_and_v_Test(CpuZeropageTest_rra_zero_sets_n_and_v_Test *this)

{
  CpuZeropageTest_rra_zero_sets_n_and_v_Test *this_local;
  
  CpuZeropageTest::~CpuZeropageTest(&this->super_CpuZeropageTest);
  return;
}

Assistant:

TEST_F(CpuZeropageTest, rra_zero_sets_n_and_v) {
    registers.p = Z_FLAG;
    registers.a = 0b0100'0000;
    expected.a = 0b1000'0000;
    expected.p = N_FLAG | V_FLAG;
    memory_content = 0b1000'0000;
    run_readwrite_instruction(RRA_ZERO, 0b0100'0000);
}